

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall duckdb::DBConfig::AddAllowedDirectory(DBConfig *this,string *path)

{
  bool bVar1;
  InvalidInputException *this_00;
  string allowed_directory;
  string local_60;
  string local_40;
  
  SanitizeAllowedPath(&local_40,this,path);
  if (local_40._M_string_length != 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/","");
    bVar1 = StringUtil::EndsWith((string *)&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (!bVar1) {
      ::std::__cxx11::string::append((char *)&local_40);
    }
    ::std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this->options).allowed_directories,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Cannot provide an empty string for allowed_directory","");
  InvalidInputException::InvalidInputException(this_00,&local_60);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DBConfig::AddAllowedDirectory(const string &path) {
	auto allowed_directory = SanitizeAllowedPath(path);
	if (allowed_directory.empty()) {
		throw InvalidInputException("Cannot provide an empty string for allowed_directory");
	}
	// ensure the directory ends with a path separator
	if (!StringUtil::EndsWith(allowed_directory, "/")) {
		allowed_directory += "/";
	}
	options.allowed_directories.insert(allowed_directory);
}